

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1parse.c
# Opt level: O2

FT_Error read_pfb_tag(FT_Stream stream,FT_UShort *atag,FT_ULong *asize)

{
  FT_Error FVar1;
  FT_UShort FVar2;
  undefined8 in_RAX;
  FT_ULong FVar3;
  int local_34 [2];
  FT_Error error;
  
  local_34[0] = (int)((ulong)in_RAX >> 0x20);
  *atag = 0;
  *asize = 0;
  FVar2 = FT_Stream_ReadUShort(stream,local_34);
  if (local_34[0] == 0) {
    FVar1 = 0;
    if ((ushort)(FVar2 + 0x7fff) < 2) {
      FVar3 = FT_Stream_ReadULongLE(stream,local_34);
      FVar1 = local_34[0];
      if (local_34[0] == 0) {
        *asize = FVar3;
        FVar1 = 0;
      }
    }
    local_34[0] = FVar1;
    *atag = FVar2;
  }
  return local_34[0];
}

Assistant:

static FT_Error
  read_pfb_tag( FT_Stream   stream,
                FT_UShort  *atag,
                FT_ULong   *asize )
  {
    FT_Error   error;
    FT_UShort  tag;
    FT_ULong   size;


    *atag  = 0;
    *asize = 0;

    if ( !FT_READ_USHORT( tag ) )
    {
      if ( tag == 0x8001U || tag == 0x8002U )
      {
        if ( !FT_READ_ULONG_LE( size ) )
          *asize = size;
      }

      *atag = tag;
    }

    return error;
  }